

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O3

Writer * __thiscall xe::xml::Writer::operator<<(Writer *this,BeginElement *begin)

{
  ostream *poVar1;
  State SVar2;
  int iVar3;
  
  SVar2 = this->m_state;
  if (SVar2 == STATE_ELEMENT) {
    std::__ostream_insert<char,std::char_traits<char>>(this->m_rawDst,">",1);
    SVar2 = this->m_state;
  }
  if (SVar2 - STATE_ELEMENT < 2) {
    std::__ostream_insert<char,std::char_traits<char>>(this->m_rawDst,"\n",1);
    if (0 < (int)((ulong)((long)(this->m_elementStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_elementStack).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      iVar3 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(this->m_rawDst,"  ",2);
        iVar3 = iVar3 + 1;
      } while (iVar3 < (int)((ulong)((long)(this->m_elementStack).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->m_elementStack).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
  }
  poVar1 = this->m_rawDst;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(begin->element)._M_dataplus._M_p,(begin->element)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_elementStack,&begin->element);
  this->m_state = STATE_ELEMENT;
  return this;
}

Assistant:

Writer& Writer::operator<< (const BeginElement& begin)
{
	if (m_state == STATE_ELEMENT)
		m_rawDst << ">";

	if (m_state == STATE_ELEMENT || m_state == STATE_ELEMENT_END)
	{
		m_rawDst << "\n";
		for (int i = 0; i < (int)m_elementStack.size(); i++)
			m_rawDst << "  ";
	}

	m_rawDst << "<" << begin.element;

	m_elementStack.push_back(begin.element);
	m_state = STATE_ELEMENT;

	return *this;
}